

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

void Au_ManAddNtk(Au_Man_t *pMan,Au_Ntk_t *p)

{
  int iVar1;
  
  iVar1 = Au_ManFindNtk(pMan,p->pName);
  if (iVar1 == -1) {
    p->pMan = pMan;
    pMan->nRefs = pMan->nRefs + 1;
    p->Id = (pMan->vNtks).nSize;
    Vec_PtrPush(&pMan->vNtks,p);
    return;
  }
  __assert_fail("Au_ManFindNtk(pMan, Au_NtkName(p)) == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                ,0x174,"void Au_ManAddNtk(Au_Man_t *, Au_Ntk_t *)");
}

Assistant:

void Au_ManAddNtk( Au_Man_t * pMan, Au_Ntk_t * p )
{
    assert( Au_ManFindNtk(pMan, Au_NtkName(p)) == -1 );
    p->pMan = pMan; pMan->nRefs++;
    p->Id = Vec_PtrSize( &pMan->vNtks );
    Vec_PtrPush( &pMan->vNtks, p );
}